

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_combo_begin_color(nk_context *ctx,nk_color color,nk_vec2 size)

{
  nk_command_buffer *b;
  nk_vec2 nVar1;
  nk_symbol_type type;
  nk_window *win;
  nk_rect r;
  nk_widget_layout_states nVar2;
  int iVar3;
  long lVar4;
  nk_context *i;
  float fVar5;
  float fVar6;
  float fVar7;
  nk_rect r_00;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect header_00;
  float local_a8;
  float local_98;
  float fStack_94;
  nk_rect header;
  nk_rect local_50;
  nk_rect button;
  
  if (((ctx != (nk_context *)0x0) && (win = ctx->current, win != (nk_window *)0x0)) &&
     (win->layout != (nk_panel *)0x0)) {
    nVar2 = nk_widget(&header,ctx);
    if (nVar2 != NK_WIDGET_INVALID) {
      i = ctx;
      if ((win->layout->flags & 0x800) != 0) {
        i = (nk_context *)0x0;
      }
      if (nVar2 == NK_WIDGET_ROM) {
        i = (nk_context *)0x0;
      }
      r.w = header.w;
      r.h = header.h;
      r.x = header.x;
      r.y = header.y;
      fVar7 = header.h;
      iVar3 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
      lVar4 = 0x1ad8;
      if ((ctx->last_widget_state & 0x20) == 0) {
        lVar4 = (ulong)(ctx->last_widget_state & 0x10) * 2 + 0x1a98;
      }
      b = &win->buffer;
      if (*(int *)((long)&(ctx->input).keyboard.keys[0].down + lVar4) == 1) {
        r_00.w = header.w;
        r_00.h = header.h;
        r_00.x = header.x;
        r_00.y = header.y;
        nk_draw_image(b,r_00,(nk_image *)((long)&(ctx->input).keyboard.keys[1].down + lVar4),
                      (nk_color)0xffffffff);
      }
      else {
        rect.w = header.w;
        rect.h = header.h;
        rect.x = header.x;
        rect.y = header.y;
        nk_fill_rect(b,rect,(ctx->style).combo.rounding,
                     *(nk_color *)((long)&(ctx->input).keyboard.keys[1].down + lVar4));
        rect_00.w = header.w;
        rect_00.h = header.h;
        rect_00.x = header.x;
        rect_00.y = header.y;
        nk_stroke_rect(b,rect_00,(ctx->style).combo.rounding,(ctx->style).combo.border,
                       (ctx->style).combo.border_color);
      }
      lVar4 = 0x1bcc;
      if ((ctx->last_widget_state & 0x10) == 0) {
        lVar4 = (ulong)(iVar3 != 0) * 8 + 0x1bc8;
      }
      type = *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar4);
      fVar5 = (ctx->style).combo.button_padding.y;
      local_98 = header.x;
      fStack_94 = header.y;
      button.y = fStack_94 + fVar5;
      button.w = fVar7 - (fVar5 + fVar5);
      local_a8 = header.w;
      button.x = ((local_98 + local_a8) - fVar7) - (ctx->style).combo.button_padding.x;
      nVar1 = (ctx->style).combo.button.padding;
      fVar5 = nVar1.x;
      fVar6 = nVar1.y;
      local_50.x = button.x + fVar5;
      local_50.y = button.y + fVar6;
      local_50.w = button.w - (fVar5 + fVar5);
      local_50.h = button.w - (fVar6 + fVar6);
      nVar1 = (ctx->style).combo.content_padding;
      fVar5 = nVar1.x;
      fVar6 = nVar1.y;
      rect_01.x = fVar5 + fVar5 + local_98;
      rect_01.y = fVar6 + fVar6 + fStack_94;
      rect_01.w = (button.x - (fVar5 + (ctx->style).combo.spacing.x)) - rect_01.x;
      rect_01.h = fVar6 * -4.0 + fVar7;
      button.h = button.w;
      nk_fill_rect(b,rect_01,0.0,color);
      nk_draw_button_symbol
                (b,&button,&local_50,ctx->last_widget_state,&(ctx->style).combo.button,type,
                 (ctx->style).font);
      header_00.w = header.w;
      header_00.h = header.h;
      header_00.x = header.x;
      header_00.y = header.y;
      iVar3 = nk_combo_begin(ctx,win,size,(uint)(iVar3 != 0),header_00);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

NK_API int
nk_combo_begin_color(struct nk_context *ctx, struct nk_color color, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED)
        background = &style->combo.active;
    else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
        background = &style->combo.hover;
    else background = &style->combo.normal;

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(&win->buffer, header, &background->data.image,nk_white);
    } else {
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect bounds;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw color */
        bounds.h = header.h - 4 * style->combo.content_padding.y;
        bounds.y = header.y + 2 * style->combo.content_padding.y;
        bounds.x = header.x + 2 * style->combo.content_padding.x;
        bounds.w = (button.x - (style->combo.content_padding.x + style->combo.spacing.x)) - bounds.x;
        nk_fill_rect(&win->buffer, bounds, 0, color);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}